

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# boost_unordered.hpp
# Opt level: O1

locator * __thiscall
boost::unordered::detail::foa::
table_core<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char,std::char_traits<char>>,slang::ConstantValue_const*>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<std::basic_string_view<char,std::char_traits<char>>,void>,std::equal_to<std::basic_string_view<char,std::char_traits<char>>>,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,slang::ConstantValue_const*>>>
::
nosize_unchecked_emplace_at<std::pair<std::basic_string_view<char,std::char_traits<char>>&&,slang::ConstantValue_const*&&>>
          (locator *__return_storage_ptr__,
          table_core<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char,std::char_traits<char>>,slang::ConstantValue_const*>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<std::basic_string_view<char,std::char_traits<char>>,void>,std::equal_to<std::basic_string_view<char,std::char_traits<char>>>,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,slang::ConstantValue_const*>>>
          *this,arrays_type *arrays_,size_t pos0,size_t hash,
          pair<std::basic_string_view<char,_std::char_traits<char>_>_&&,_const_slang::ConstantValue_*&&>
          *args)

{
  group_type_pointer pgVar1;
  group_type_pointer pgVar2;
  uint uVar3;
  ushort uVar4;
  char *pcVar5;
  ulong uVar6;
  value_type_pointer ppVar7;
  long lVar8;
  group_type_pointer pgVar9;
  undefined1 auVar10 [16];
  
  pgVar9 = __return_storage_ptr__->pg;
  uVar6 = (ulong)__return_storage_ptr__->n;
  ppVar7 = __return_storage_ptr__->p;
  lVar8 = 1;
  while( true ) {
    pgVar1 = arrays_->groups_ + pos0;
    pgVar2 = arrays_->groups_ + pos0;
    auVar10[0] = -(pgVar2->m[0].n == '\0');
    auVar10[1] = -(pgVar2->m[1].n == '\0');
    auVar10[2] = -(pgVar2->m[2].n == '\0');
    auVar10[3] = -(pgVar2->m[3].n == '\0');
    auVar10[4] = -(pgVar2->m[4].n == '\0');
    auVar10[5] = -(pgVar2->m[5].n == '\0');
    auVar10[6] = -(pgVar2->m[6].n == '\0');
    auVar10[7] = -(pgVar2->m[7].n == '\0');
    auVar10[8] = -(pgVar2->m[8].n == '\0');
    auVar10[9] = -(pgVar2->m[9].n == '\0');
    auVar10[10] = -(pgVar2->m[10].n == '\0');
    auVar10[0xb] = -(pgVar2->m[0xb].n == '\0');
    auVar10[0xc] = -(pgVar2->m[0xc].n == '\0');
    auVar10[0xd] = -(pgVar2->m[0xd].n == '\0');
    auVar10[0xe] = -(pgVar2->m[0xe].n == '\0');
    auVar10[0xf] = -(pgVar2->m[0xf].n == '\0');
    uVar4 = (ushort)(SUB161(auVar10 >> 7,0) & 1) | (ushort)(SUB161(auVar10 >> 0xf,0) & 1) << 1 |
            (ushort)(SUB161(auVar10 >> 0x17,0) & 1) << 2 |
            (ushort)(SUB161(auVar10 >> 0x1f,0) & 1) << 3 |
            (ushort)(SUB161(auVar10 >> 0x27,0) & 1) << 4 |
            (ushort)(SUB161(auVar10 >> 0x2f,0) & 1) << 5 |
            (ushort)(SUB161(auVar10 >> 0x37,0) & 1) << 6 |
            (ushort)(SUB161(auVar10 >> 0x3f,0) & 1) << 7 |
            (ushort)(SUB161(auVar10 >> 0x47,0) & 1) << 8 |
            (ushort)(SUB161(auVar10 >> 0x4f,0) & 1) << 9 |
            (ushort)(SUB161(auVar10 >> 0x57,0) & 1) << 10 |
            (ushort)(SUB161(auVar10 >> 0x5f,0) & 1) << 0xb |
            (ushort)(SUB161(auVar10 >> 0x67,0) & 1) << 0xc |
            (ushort)(SUB161(auVar10 >> 0x6f,0) & 1) << 0xd |
            (ushort)(SUB161(auVar10 >> 0x77,0) & 1) << 0xe;
    if (uVar4 == 0) {
      pgVar1->m[0xf].n = pgVar1->m[0xf].n | '\x01' << ((byte)hash & 7);
    }
    else {
      uVar3 = 0;
      if (uVar4 != 0) {
        for (; (uVar4 >> uVar3 & 1) == 0; uVar3 = uVar3 + 1) {
        }
      }
      uVar6 = (ulong)uVar3;
      ppVar7 = arrays_->elements_ + pos0 * 0xf + uVar6;
      pcVar5 = args->first->_M_str;
      (ppVar7->first)._M_len = args->first->_M_len;
      (ppVar7->first)._M_str = pcVar5;
      ppVar7->second = *args->second;
      pgVar1->m[uVar6].n =
           *(uchar *)(&group15<boost::unordered::detail::foa::plain_integral>::
                       match_word(unsigned_long)::word + (hash & 0xff));
      pgVar9 = pgVar1;
    }
    if (uVar4 != 0) break;
    pos0 = pos0 + lVar8 & arrays_->groups_size_mask;
    lVar8 = lVar8 + 1;
  }
  __return_storage_ptr__->n = (uint)uVar6;
  __return_storage_ptr__->p = ppVar7;
  __return_storage_ptr__->pg = pgVar9;
  return __return_storage_ptr__;
}

Assistant:

locator nosize_unchecked_emplace_at(const arrays_type& arrays_, std::size_t pos0,
                                        std::size_t hash, Args&&... args) {
        for (prober pb(pos0);; pb.next(arrays_.groups_size_mask)) {
            auto pos = pb.get();
            auto pg = arrays_.groups() + pos;
            auto mask = pg->match_available();
            if (BOOST_LIKELY(mask != 0)) {
                auto n = unchecked_countr_zero(mask);
                auto p = arrays_.elements() + pos * N + n;
                construct_element(p, std::forward<Args>(args)...);
                pg->set(n, hash);
                BOOST_UNORDERED_ADD_STATS(cstats.insertion, (pb.length()));
                return {pg, n, p};
            }
            else
                pg->mark_overflow(hash);
        }
    }